

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.c
# Opt level: O0

apx_error_t
apx_nodeData_write_require_port_data
          (apx_nodeData_t *self,apx_size_t offset,uint8_t *src,apx_size_t size)

{
  apx_size_t size_local;
  uint8_t *src_local;
  apx_size_t offset_local;
  apx_nodeData_t *self_local;
  
  if (self == (apx_nodeData_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&self->lock);
    if ((ulong)self->require_port_data_size < (ulong)offset + (ulong)size) {
      pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
      self_local._4_4_ = 1;
    }
    else {
      memcpy(self->require_port_data + offset,src,(ulong)size);
      pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_nodeData_write_require_port_data(apx_nodeData_t* self, apx_size_t offset, uint8_t const* src, apx_size_t size)
{
   if (self != NULL)
   {
      MUTEX_LOCK(self->lock);
      if (((size_t)offset + size) > self->require_port_data_size)
      {
         MUTEX_UNLOCK(self->lock);
         return APX_INVALID_ARGUMENT_ERROR;
      }
      memcpy(self->require_port_data + offset, src, size);
      MUTEX_UNLOCK(self->lock);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}